

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O1

void __thiscall RVO::Agent::insertObstacleNeighbor(Agent *this,Obstacle *obstacle,float rangeSq)

{
  pointer *pppVar1;
  float fVar2;
  float fVar3;
  iterator __position;
  pointer ppVar4;
  long lVar5;
  long lVar6;
  Obstacle **ppOVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  pair<float,_const_RVO::Obstacle_*> local_20;
  
  fVar16 = (this->position_).x_;
  fVar8 = (this->position_).y_;
  fVar2 = (obstacle->point_).x_;
  fVar15 = fVar16 - fVar2;
  fVar3 = (obstacle->point_).y_;
  fVar13 = fVar8 - fVar3;
  fVar9 = (obstacle->nextObstacle_->point_).x_;
  fVar10 = (obstacle->nextObstacle_->point_).y_;
  fVar11 = fVar9 - fVar2;
  fVar12 = fVar10 - fVar3;
  fVar14 = (fVar15 * fVar11 + fVar13 * fVar12) / (fVar11 * fVar11 + fVar12 * fVar12);
  if (0.0 <= fVar14) {
    if (fVar14 <= 1.0) {
      fVar9 = fVar2 + fVar11 * fVar14;
      fVar10 = fVar3 + fVar12 * fVar14;
    }
    fVar8 = fVar8 - fVar10;
    fVar16 = fVar16 - fVar9;
    fVar16 = fVar16 * fVar16 + fVar8 * fVar8;
  }
  else {
    fVar16 = fVar15 * fVar15 + fVar13 * fVar13;
  }
  if (fVar16 < rangeSq) {
    __position._M_current =
         (this->obstacleNeighbors_).
         super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->obstacleNeighbors_).
        super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_20.first = fVar16;
      local_20.second = obstacle;
      std::
      vector<std::pair<float,RVO::Obstacle_const*>,std::allocator<std::pair<float,RVO::Obstacle_const*>>>
      ::_M_realloc_insert<std::pair<float,RVO::Obstacle_const*>>
                ((vector<std::pair<float,RVO::Obstacle_const*>,std::allocator<std::pair<float,RVO::Obstacle_const*>>>
                  *)&this->obstacleNeighbors_,__position,&local_20);
    }
    else {
      *(ulong *)__position._M_current = CONCAT44(local_20._4_4_,fVar16);
      (__position._M_current)->second = obstacle;
      pppVar1 = &(this->obstacleNeighbors_).
                 super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pppVar1 = *pppVar1 + 1;
    }
    ppVar4 = (this->obstacleNeighbors_).
             super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)(this->obstacleNeighbors_).
                  super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4 >> 4;
    lVar5 = lVar6 + -1;
    if (lVar5 != 0) {
      ppOVar7 = &ppVar4[lVar6 + -1].second;
      do {
        if (*(float *)(ppOVar7 + -3) <= fVar16) goto LAB_001088d7;
        ((pair<float,_const_RVO::Obstacle_*> *)(ppOVar7 + -1))->first = *(float *)(ppOVar7 + -3);
        *ppOVar7 = ppOVar7[-2];
        ppOVar7 = ppOVar7 + -2;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
      lVar5 = 0;
    }
LAB_001088d7:
    ppVar4[lVar5].first = fVar16;
    ppVar4[lVar5].second = obstacle;
  }
  return;
}

Assistant:

void Agent::insertObstacleNeighbor(const Obstacle *obstacle, float rangeSq)
	{
		const Obstacle *const nextObstacle = obstacle->nextObstacle_;

		const float distSq = distSqPointLineSegment(obstacle->point_, nextObstacle->point_, position_);

		if (distSq < rangeSq) {
			obstacleNeighbors_.push_back(std::make_pair(distSq, obstacle));

			size_t i = obstacleNeighbors_.size() - 1;

			while (i != 0 && distSq < obstacleNeighbors_[i - 1].first) {
				obstacleNeighbors_[i] = obstacleNeighbors_[i - 1];
				--i;
			}

			obstacleNeighbors_[i] = std::make_pair(distSq, obstacle);
		}
	}